

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdPlugin.c
# Opt level: O2

int Cmd_CommandAbcPlugIn(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Abc_Frame_t *pAVar1;
  Gia_Man_t **p;
  int iVar2;
  Vec_Str_t *pVVar3;
  char *pcVar4;
  abctime aVar5;
  abctime aVar6;
  FILE *__stream;
  Vec_Int_t *pVVar7;
  Vec_Int_t *__ptr;
  Abc_Cex_t *p_00;
  Gia_Man_t *pGVar8;
  int iVar9;
  ulong uVar10;
  char *format;
  ulong uVar11;
  uint iFrame;
  char *pFileOut;
  char *pFileIn;
  int local_44;
  Abc_Frame_t *local_40;
  Gia_Man_t **local_38;
  
  if (pAbc->pGia == (Gia_Man_t *)0x0) {
    if ((((argc == 2) && (pcVar4 = argv[1], *pcVar4 == '-')) && (pcVar4[1] == 'h')) &&
       (pcVar4[2] == '\0')) {
      pVVar3 = Vec_StrAlloc(100);
      pcVar4 = Abc_GetBinaryName(pAbc,argc,argv);
      Vec_StrAppend(pVVar3,pcVar4);
      Vec_StrAppend(pVVar3," -abc ");
      Vec_StrAppend(pVVar3,*argv);
      Vec_StrAppend(pVVar3," -h");
      Vec_StrPush(pVVar3,'\0');
      Util_SignalSystem(pVVar3->pArray);
      Vec_StrFree(pVVar3);
      return 1;
    }
    pcVar4 = "Current AIG does not exist (try command &ps).\n";
    goto LAB_00288bc6;
  }
  iVar2 = Util_SignalTmpFile("__abctmp_",".aig",&pFileIn);
  if (iVar2 != -1) {
    close(iVar2);
    iVar2 = Util_SignalTmpFile("__abctmp_",".out",&pFileOut);
    if (iVar2 != -1) {
      close(iVar2);
      uVar10 = 0;
      if ((*argv[(long)argc + -1] == '!') && (argv[(long)argc + -1][1] == '\0')) {
        Abc_Print(0,"Input file \"%s\" and output file \"%s\" are not deleted.\n",pFileIn);
        argc = argc - 1;
        local_44 = 1;
      }
      else {
        local_44 = 0;
      }
      local_38 = &pAbc->pGia;
      pcVar4 = pFileIn;
      Gia_AigerWrite(pAbc->pGia,pFileIn,0,0);
      iVar2 = (int)pcVar4;
      pVVar3 = Vec_StrAlloc(100);
      local_40 = pAbc;
      pcVar4 = Abc_GetBinaryName(pAbc,iVar2,argv);
      Vec_StrAppend(pVVar3,pcVar4);
      Vec_StrAppend(pVVar3," -abc");
      Vec_StrAppend(pVVar3," -input=");
      Vec_StrAppend(pVVar3,pFileIn);
      Vec_StrAppend(pVVar3," -output=");
      Vec_StrAppend(pVVar3,pFileOut);
      uVar11 = (ulong)(uint)argc;
      if (argc < 1) {
        uVar11 = uVar10;
      }
      for (; uVar11 != uVar10; uVar10 = uVar10 + 1) {
        Vec_StrAppend(pVVar3," ");
        Vec_StrAppend(pVVar3,argv[uVar10]);
      }
      Vec_StrPush(pVVar3,'\0');
      aVar5 = Abc_Clock();
      pcVar4 = pVVar3->pArray;
      iVar2 = Util_SignalSystem(pcVar4);
      if (iVar2 != 0) {
        Abc_Print(-1,"The following command has returned non-zero exit status:\n");
        format = "\"%s\"\n";
        pFileOut = pcVar4;
LAB_00288ba1:
        Abc_Print(-1,format,pFileOut);
        return 1;
      }
      aVar6 = Abc_Clock();
      Vec_StrFree(pVVar3);
      __stream = fopen(pFileOut,"r");
      if (__stream == (FILE *)0x0) {
        format = "There is no output file \"%s\".\n";
        goto LAB_00288ba1;
      }
      fclose(__stream);
      iVar2 = Extra_FileSize(pFileOut);
      p = local_38;
      if (iVar2 < 1) goto LAB_00288ec8;
      iVar2 = Abc_ManReadStatus(pFileOut,"result:");
      pAVar1 = local_40;
      local_40->Status = iVar2;
      iVar2 = Abc_ManReadInteger(pFileOut,"bug-free-depth:");
      pAVar1->nFrames = iVar2;
      pVVar7 = Abc_ManReadBinary(pFileOut,"abstraction:");
      pAVar1->pGia->vFlopClasses = pVVar7;
      pVVar7 = Abc_ManReadBinary(pFileOut,"counter-example:");
      if (pVVar7 != (Vec_Int_t *)0x0) {
        iVar2 = (*p)->nRegs;
        iVar9 = pVVar7->nSize - iVar2;
        iVar2 = (*p)->vCis->nSize - iVar2;
        __ptr = pVVar7;
        if (iVar9 % iVar2 != 0) {
          Abc_Print(1,"Adjusting counter-example by adding zeros for PIs without fanout.\n");
          __ptr = Abc_ManExpandCex(*p,pVVar7);
          free(pVVar7->pArray);
          free(pVVar7);
          iVar9 = (*p)->nRegs;
          iVar2 = (*p)->vCis->nSize - iVar9;
          iVar9 = __ptr->nSize - iVar9;
        }
        if (iVar9 % iVar2 == 0) {
          iFrame = iVar9 / iVar2 - 1;
          Abc_Print(1,"Problem is satisfiable. Found counter-example in frame %d.  ",(ulong)iFrame);
          Abc_Print(1,"%s =","Time");
          pAVar1 = local_40;
          Abc_Print(1,"%9.2f sec\n",(double)(aVar6 - aVar5) / 1000000.0);
          if (pAVar1->pCex != (Abc_Cex_t *)0x0) {
            free(pAVar1->pCex);
            pAVar1->pCex = (Abc_Cex_t *)0x0;
          }
          iVar2 = pAVar1->pGia->nRegs;
          p_00 = Abc_CexCreate(iVar2,pAVar1->pGia->vCis->nSize - iVar2,__ptr->pArray,iFrame,0,0);
          pAVar1->pCex = p_00;
          iVar2 = Gia_ManFindFailedPoCex(pAVar1->pGia,p_00,0);
          pAVar1->pCex->iPo = iVar2;
          if (iVar2 != -1) {
            pcVar4 = "Returned counter-example successfully verified in ABC.\n";
            goto LAB_00288e89;
          }
          Abc_Print(1,"Generated counter-example is INVALID.\n");
          if (pAVar1->pCex != (Abc_Cex_t *)0x0) {
            free(pAVar1->pCex);
            pAVar1->pCex = (Abc_Cex_t *)0x0;
          }
        }
        else {
          pcVar4 = "Counter example has a wrong length.\n";
LAB_00288e89:
          Abc_Print(1,pcVar4);
        }
        free(__ptr->pArray);
        free(__ptr);
      }
      pGVar8 = Abc_ManReadAig(pFileOut,"aig:");
      if (pGVar8 != (Gia_Man_t *)0x0) {
        Gia_ManStopP(p);
        *p = pGVar8;
      }
LAB_00288ec8:
      iVar2 = local_44;
      Util_SignalTmpFileRemove(pFileIn,local_44);
      Util_SignalTmpFileRemove(pFileOut,iVar2);
      if (pFileIn != (char *)0x0) {
        free(pFileIn);
        pFileIn = (char *)0x0;
      }
      free(pFileOut);
      return 0;
    }
    if (pFileIn != (char *)0x0) {
      free(pFileIn);
      pFileIn = (char *)0x0;
    }
  }
  pcVar4 = "Cannot create a temporary file.\n";
LAB_00288bc6:
  Abc_Print(-1,pcVar4);
  return 1;
}

Assistant:

int Cmd_CommandAbcPlugIn( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    char * pFileIn, * pFileOut;
    Vec_Str_t * vCommand;
    Vec_Int_t * vCex;
    FILE * pFile;
    Gia_Man_t * pGia;
    int i, fd;
    abctime clk;
    int fLeaveFiles;
/*
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Current network does not exist\n" );
        return 1;
    }
    if ( !Abc_NtkIsStrash( pNtk) )
    {
        Abc_Print( -1, "The current network is not an AIG. Cannot continue.\n" );
        return 1;
    }
*/

    if ( pAbc->pGia == NULL )
    {
        if (argc == 2 && strcmp(argv[1], "-h") == 0)
        {
            // Run command to produce help string:
            vCommand = Vec_StrAlloc( 100 );
            Vec_StrAppend( vCommand, Abc_GetBinaryName( pAbc, argc, argv ) );
            Vec_StrAppend( vCommand, " -abc " );
            Vec_StrAppend( vCommand, argv[0] );
            Vec_StrAppend( vCommand, " -h" );
            Vec_StrPush( vCommand, 0 );
            Util_SignalSystem( Vec_StrArray(vCommand) );
            Vec_StrFree( vCommand );
        }
        else
        {
            Abc_Print( -1, "Current AIG does not exist (try command &ps).\n" );
        }
        return 1;
    }

    // create temp file
    fd = Util_SignalTmpFile( "__abctmp_", ".aig", &pFileIn );
    if ( fd == -1 )
    {
        Abc_Print( -1, "Cannot create a temporary file.\n" );
        return 1;
    }
#ifdef WIN32
    _close( fd );
#else
    close( fd );
#endif

    // create temp file
    fd = Util_SignalTmpFile( "__abctmp_", ".out", &pFileOut );
    if ( fd == -1 )
    {
        ABC_FREE( pFileIn );
        Abc_Print( -1, "Cannot create a temporary file.\n" );
        return 1;
    }
#ifdef WIN32
    _close( fd );
#else
    close( fd );
#endif


    // write current network into a file
/*
    {
        extern Aig_Man_t * Abc_NtkToDar( Abc_Ntk_t * pNtk, int fExors, int fRegisters );
        Aig_Man_t * pAig;
        pAig = Abc_NtkToDar( pNtk, 0, 1 );
        Ioa_WriteAiger( pAig, pFileIn, 0, 0 );
        Aig_ManStop( pAig );
    }
*/ 
    // check what to do with the files
    fLeaveFiles = 0;
    if ( strcmp( argv[argc-1], "!" ) == 0 )
    {
        Abc_Print( 0, "Input file \"%s\" and output file \"%s\" are not deleted.\n", pFileIn, pFileOut );
        fLeaveFiles = 1;
        argc--;
    }

    // create input file
    Gia_AigerWrite( pAbc->pGia, pFileIn, 0, 0 );

    // create command line
    vCommand = Vec_StrAlloc( 100 );
    Vec_StrAppend( vCommand, Abc_GetBinaryName( pAbc, argc, argv ) );
    // add input/output file
    Vec_StrAppend( vCommand, " -abc" );
//    Vec_StrAppend( vCommand, " -input=C:/_projects/abc/_TEST/hwmcc/139442p0.aig" );
    Vec_StrAppend( vCommand, " -input=" );
    Vec_StrAppend( vCommand, pFileIn );
    Vec_StrAppend( vCommand, " -output=" );
    Vec_StrAppend( vCommand, pFileOut );
    // add other arguments
    for ( i = 0; i < argc; i++ )
    {
        Vec_StrAppend( vCommand, " " );
        Vec_StrAppend( vCommand, argv[i] );
    }
    Vec_StrPush( vCommand, 0 );

    // run the command line
//printf( "Running command line: %s\n", Vec_StrArray(vCommand) ); 

    clk = Abc_Clock();
    if ( Util_SignalSystem( Vec_StrArray(vCommand) ) )
    {
        Abc_Print( -1, "The following command has returned non-zero exit status:\n" );
        Abc_Print( -1, "\"%s\"\n", Vec_StrArray(vCommand) );
        return 1;
    }
    clk = Abc_Clock() - clk;
    Vec_StrFree( vCommand );

    // check if the output file exists
    if ( (pFile = fopen( pFileOut, "r" )) == NULL )
    {
        Abc_Print( -1, "There is no output file \"%s\".\n", pFileOut );
        return 1;
    }
    fclose( pFile );

    // process the output
    if ( Extra_FileSize(pFileOut) > 0 )
    {
        // get status
        pAbc->Status  = Abc_ManReadStatus( pFileOut, "result:" );
        // get bug-free depth
        pAbc->nFrames = Abc_ManReadInteger( pFileOut, "bug-free-depth:" );
        // get abstraction
        pAbc->pGia->vFlopClasses = Abc_ManReadBinary( pFileOut, "abstraction:" );
        // get counter-example
        vCex = Abc_ManReadBinary( pFileOut, "counter-example:" );
        if ( vCex ) 
        {
            int nFrames, nRemain;

            nFrames = (Vec_IntSize(vCex) - Gia_ManRegNum(pAbc->pGia)) / Gia_ManPiNum(pAbc->pGia);
            nRemain = (Vec_IntSize(vCex) - Gia_ManRegNum(pAbc->pGia)) % Gia_ManPiNum(pAbc->pGia);
            if ( nRemain != 0 )
            {   
                Vec_Int_t * vTemp;
                Abc_Print( 1, "Adjusting counter-example by adding zeros for PIs without fanout.\n" );
                // expand the counter-example to include PIs without fanout
                vCex = Abc_ManExpandCex( pAbc->pGia, vTemp = vCex );
                Vec_IntFree( vTemp );
            }

            nFrames = (Vec_IntSize(vCex) - Gia_ManRegNum(pAbc->pGia)) / Gia_ManPiNum(pAbc->pGia);
            nRemain = (Vec_IntSize(vCex) - Gia_ManRegNum(pAbc->pGia)) % Gia_ManPiNum(pAbc->pGia);
            if ( nRemain != 0 )
                Abc_Print( 1, "Counter example has a wrong length.\n" );
            else
            {
                Abc_Print( 1, "Problem is satisfiable. Found counter-example in frame %d.  ", nFrames-1 );
                Abc_PrintTime( 1, "Time", clk );
                ABC_FREE( pAbc->pCex );
                pAbc->pCex = Abc_CexCreate( Gia_ManRegNum(pAbc->pGia), Gia_ManPiNum(pAbc->pGia), Vec_IntArray(vCex), nFrames-1, 0, 0 );

//                Abc_CexPrint( pAbc->pCex );

//                if ( !Gia_ManVerifyCex( pAbc->pGia, pAbc->pCex, 0 ) )
//                    Abc_Print( 1, "Generated counter-example is INVALID.\n" );

                // remporary work-around to detect the output number - October 18, 2010
                pAbc->pCex->iPo = Gia_ManFindFailedPoCex( pAbc->pGia, pAbc->pCex, 0 );
                if ( pAbc->pCex->iPo == -1 )
                {
                    Abc_Print( 1, "Generated counter-example is INVALID.\n" );
                    ABC_FREE( pAbc->pCex );
                }
                else
                {
                    Abc_Print( 1, "Returned counter-example successfully verified in ABC.\n" );
                }
            }
            Vec_IntFreeP( &vCex );
        }
        // get AIG if present
        pGia = Abc_ManReadAig( pFileOut, "aig:" );
        if ( pGia != NULL )
        {
            Gia_ManStopP( &pAbc->pGia );
            pAbc->pGia = pGia;                
        }
    }    

    // clean up
    Util_SignalTmpFileRemove( pFileIn, fLeaveFiles );
    Util_SignalTmpFileRemove( pFileOut, fLeaveFiles );
    
    ABC_FREE( pFileIn );
    ABC_FREE( pFileOut );
    return 0;
}